

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O0

void __thiscall klogic::mlmvn::learn(mlmvn *this,cvector *X,cvector *errs,double learning_rate)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  reference this_00;
  reference this_01;
  const_iterator Xbeg;
  const_iterator Xend;
  size_type sVar4;
  reference this_02;
  const_reference error;
  int local_54;
  int k;
  const_iterator input_end;
  const_iterator input_begin;
  cvector *layer_errors;
  vector<klogic::mvn,_std::allocator<klogic::mvn>_> *layer_neurons;
  bool variable_rate;
  int layer;
  double learning_rate_local;
  cvector *errs_local;
  cvector *X_local;
  mlmvn *this_local;
  
  calculate_errors(this,errs);
  mlmvn_forward_base::start(&this->calculator,X);
  do {
    iVar2 = mlmvn_forward_base::current_layer(&this->calculator);
    sVar3 = layers_count(this);
    this_00 = std::
              vector<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
              ::operator[](&this->neurons,(long)iVar2);
    this_01 = std::
              vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
              ::operator[](&this->errors,(long)iVar2);
    Xbeg = mlmvn_forward_base::input_begin(&this->calculator);
    Xend = mlmvn_forward_base::input_end(&this->calculator);
    local_54 = 0;
    while( true ) {
      sVar4 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::size(this_00);
      if (sVar4 <= (ulong)(long)local_54) break;
      this_02 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::operator[]
                          (this_00,(long)local_54);
      error = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                        (this_01,(long)local_54);
      mvn::learn(this_02,Xbeg,Xend,error,learning_rate,(ulong)(long)iVar2 < sVar3 - 1);
      local_54 = local_54 + 1;
    }
    bVar1 = mlmvn_forward_base::step(&this->calculator);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void klogic::mlmvn::learn(const klogic::cvector &X, const klogic::cvector &errs,
                          double learning_rate)
{
    // Calculate errors for all neurons (backward pass)
    calculate_errors(errs);

    // dump_errors();

    // Make a forward pass with error correction
    calculator.start(X);

    do {
        int layer = calculator.current_layer();

        // Divide by |z| for all layers except output
        bool variable_rate = layer < layers_count() - 1;

        vector<mvn>   &layer_neurons = neurons[layer];
        cvector const &layer_errors  = errors[layer];

        // Input for current layer
        cvector::const_iterator input_begin = calculator.input_begin(),
                                input_end   = calculator.input_end();

        // Learn current layer of neurons
//#pragma omp parallel
        {
//#pragma omp for
            for (int k = 0; k < layer_neurons.size(); ++k) {
                layer_neurons[k].learn(input_begin, input_end, layer_errors[k],
                                       learning_rate, variable_rate);
            }
        }
    } while (!calculator.step());

    // dump();
}